

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

void get_msurf_descriptor(integral_image *iimage,interest_point *ipoint)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int i;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int s;
  int row;
  int iVar16;
  int sample_x;
  int col;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float local_f4;
  float local_f0;
  int local_ec;
  long local_e0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  ulong local_98;
  float local_78;
  float local_68;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  auVar22._8_4_ = 0x3effffff;
  auVar22._0_8_ = 0x3effffff3effffff;
  auVar22._12_4_ = 0x3effffff;
  auVar19._8_4_ = 0x80000000;
  auVar19._0_8_ = 0x8000000080000000;
  auVar19._12_4_ = 0x80000000;
  fVar26 = ipoint->scale;
  auVar17 = vpternlogd_avx512vl(auVar22,ZEXT416((uint)ipoint->x),auVar19,0xf8);
  auVar18 = vpternlogd_avx512vl(auVar22,ZEXT416((uint)ipoint->y),auVar19,0xf8);
  auVar19 = vpternlogd_avx512vl(auVar22,ZEXT416((uint)fVar26),auVar19,0xf8);
  auVar17 = ZEXT416((uint)(ipoint->x + auVar17._0_4_));
  auVar17 = vroundss_avx(auVar17,auVar17,0xb);
  auVar18 = ZEXT416((uint)(ipoint->y + auVar18._0_4_));
  auVar18 = vroundss_avx(auVar18,auVar18,0xb);
  auVar20._0_4_ = (int)auVar17._0_4_;
  auVar20._4_4_ = (int)auVar17._4_4_;
  auVar20._8_4_ = (int)auVar17._8_4_;
  auVar20._12_4_ = (int)auVar17._12_4_;
  auVar17 = vcvtdq2pd_avx(auVar20);
  auVar40._0_8_ = (double)fVar26;
  auVar21._0_4_ = (int)auVar18._0_4_;
  auVar21._4_4_ = (int)auVar18._4_4_;
  auVar21._8_4_ = (int)auVar18._8_4_;
  auVar21._12_4_ = (int)auVar18._12_4_;
  auVar18 = vcvtdq2pd_avx(auVar21);
  auVar19 = ZEXT416((uint)(fVar26 + auVar19._0_4_));
  auVar19 = vroundss_avx(auVar19,auVar19,0xb);
  s = (int)(auVar19._0_4_ + auVar19._0_4_);
  auVar37 = ZEXT1264(ZEXT812(0));
  local_ec = -3;
  local_e0 = 0;
  local_f4 = -0.5;
  for (iVar13 = -8; iVar13 < 0xc; iVar13 = iVar13 + 5) {
    local_e0 = (long)(int)local_e0;
    iVar15 = 0;
    auVar40._8_8_ = 0;
    local_f4 = local_f4 + 1.0;
    local_98 = auVar17._0_8_;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = local_98;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = (double)(iVar13 + -4) + 4.5;
    auVar19 = vfmadd213sd_fma(auVar49,auVar40,auVar23);
    auVar41._8_8_ = 0x3fdfffffffffffff;
    auVar41._0_8_ = 0x3fdfffffffffffff;
    auVar5._12_4_ = 0x80000000;
    auVar5._0_12_ = ZEXT812(0x8000000000000000);
    auVar20 = vpternlogq_avx512vl(auVar41,auVar19,auVar5,0xf8);
    auVar42._8_8_ = 0;
    auVar42._0_8_ = auVar19._0_8_ + auVar20._0_8_;
    auVar19 = vroundsd_avx(auVar42,auVar42,0xb);
    auVar43._0_4_ = (int)auVar19._0_8_;
    auVar43._4_4_ = (int)auVar19._8_8_;
    auVar43._8_8_ = 0;
    auVar19 = vcvtdq2ps_avx(auVar43);
    iVar12 = -8;
    local_f0 = -0.5;
    while (iVar12 < 0xc) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = auVar40._0_8_;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = (double)(iVar12 + -4) + 4.5;
      auVar20 = vfmadd132sd_fma(auVar27,auVar18,auVar2);
      auVar44._8_8_ = 0x3fdfffffffffffff;
      auVar44._0_8_ = 0x3fdfffffffffffff;
      auVar6._12_4_ = 0x80000000;
      auVar6._0_12_ = ZEXT812(0x8000000000000000);
      auVar21 = vpternlogq_avx512vl(auVar44,auVar20,auVar6,0xf8);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = auVar20._0_8_ + auVar21._0_8_;
      auVar20 = vroundsd_avx(auVar28,auVar28,0xb);
      auVar29._0_4_ = (int)auVar20._0_8_;
      auVar29._4_4_ = (int)auVar20._8_8_;
      auVar29._8_8_ = 0;
      auVar20 = vcvtdq2ps_avx(auVar29);
      local_b8 = 0.0;
      fStack_b4 = 0.0;
      fStack_b0 = 0.0;
      fStack_ac = 0.0;
      for (iVar11 = iVar13 + -4; iVar11 != local_ec; iVar11 = iVar11 + 1) {
        auVar45._8_8_ = 0;
        auVar45._0_8_ = auVar40._0_8_;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = local_98;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = (double)iVar11 + 0.5;
        auVar21 = vfmadd213sd_fma(auVar30,auVar45,auVar3);
        auVar46._8_8_ = 0x3fdfffffffffffff;
        auVar46._0_8_ = 0x3fdfffffffffffff;
        auVar7._12_4_ = 0x80000000;
        auVar7._0_12_ = ZEXT812(0x8000000000000000);
        auVar22 = vpternlogq_avx512vl(auVar46,auVar21,auVar7,0xf8);
        local_78 = auVar19._0_4_;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = auVar21._0_8_ + auVar22._0_8_;
        auVar21 = vroundsd_avx(auVar31,auVar31,0xb);
        col = (int)auVar21._0_8_;
        auVar32._0_4_ = (int)auVar21._0_8_;
        auVar32._4_4_ = (int)auVar21._8_8_;
        auVar32._8_8_ = 0;
        auVar21 = vcvtdq2ps_avx(auVar32);
        iVar16 = -0xc;
        while (iVar16 != -3) {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = auVar40._0_8_;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = (double)(iVar15 + iVar16) + 0.5;
          auVar22 = vfmadd132sd_fma(auVar33,auVar18,auVar4);
          auVar47._8_8_ = 0x3fdfffffffffffff;
          auVar47._0_8_ = 0x3fdfffffffffffff;
          auVar8._12_4_ = 0x80000000;
          auVar8._0_12_ = ZEXT812(0x8000000000000000);
          auVar23 = vpternlogq_avx512vl(auVar47,auVar22,auVar8,0xf8);
          local_68 = auVar20._0_4_;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = auVar22._0_8_ + auVar23._0_8_;
          auVar22 = vroundsd_avx(auVar34,auVar34,0xb);
          row = (int)auVar22._0_8_;
          auVar35._0_4_ = (int)auVar22._0_8_;
          auVar35._4_4_ = (int)auVar22._8_8_;
          auVar35._8_8_ = 0;
          auVar22 = vcvtdq2ps_avx(auVar35);
          fVar24 = gaussian(local_78 - auVar21._0_4_,local_68 - auVar22._0_4_,fVar26 * 2.5);
          fVar25 = haarX(iimage,row,col,s);
          auVar38._0_4_ = haarY(iimage,row,col,s);
          auVar38._4_60_ = extraout_var;
          auVar22 = vinsertps_avx(auVar38._0_16_,ZEXT416((uint)fVar25),0x10);
          iVar16 = iVar16 + 1;
          auVar36._0_4_ = fVar24 * auVar22._0_4_;
          auVar36._4_4_ = fVar24 * auVar22._4_4_;
          auVar36._8_4_ = fVar24 * auVar22._8_4_;
          auVar36._12_4_ = fVar24 * auVar22._12_4_;
          auVar9._8_4_ = 0x7fffffff;
          auVar9._0_8_ = 0x7fffffff7fffffff;
          auVar9._12_4_ = 0x7fffffff;
          auVar22 = vandps_avx512vl(auVar36,auVar9);
          auVar22 = vmovlhps_avx(auVar36,auVar22);
          local_b8 = local_b8 + auVar22._0_4_;
          fStack_b4 = fStack_b4 + auVar22._4_4_;
          fStack_b0 = fStack_b0 + auVar22._8_4_;
          fStack_ac = fStack_ac + auVar22._12_4_;
        }
      }
      local_f0 = local_f0 + 1.0;
      auVar39._0_4_ = gaussian(local_f4 + -2.0,local_f0 + -2.0,1.5);
      auVar39._4_60_ = extraout_var_00;
      auVar10._4_4_ = fStack_b4;
      auVar10._0_4_ = local_b8;
      auVar10._8_4_ = fStack_b0;
      auVar10._12_4_ = fStack_ac;
      iVar15 = iVar15 + 5;
      auVar21 = vshufpd_avx(auVar10,auVar10,1);
      pfVar1 = ipoint->descriptor + local_e0;
      *pfVar1 = local_b8 * auVar39._0_4_;
      pfVar1[1] = fStack_b4 * auVar39._0_4_;
      pfVar1[2] = fStack_b0 * auVar39._0_4_;
      pfVar1[3] = fStack_ac * auVar39._0_4_;
      auVar48._0_4_ = local_b8 * local_b8;
      auVar48._4_4_ = fStack_b4 * fStack_b4;
      auVar48._8_4_ = fStack_b0 * fStack_b0;
      auVar48._12_4_ = fStack_ac * fStack_ac;
      local_e0 = local_e0 + 4;
      auVar20 = vmovshdup_avx(auVar48);
      auVar20 = vfmadd231ss_fma(auVar20,auVar10,auVar10);
      iVar12 = iVar12 + 5;
      auVar21 = vfmadd213ss_fma(auVar21,auVar21,auVar20);
      auVar20 = vshufps_avx(auVar10,auVar10,0xff);
      auVar20 = vfmadd213ss_fma(auVar20,auVar20,auVar21);
      auVar20 = vfmadd231ss_fma(ZEXT416(auVar37._0_4_),auVar39._0_16_,
                                ZEXT416((uint)(auVar20._0_4_ * auVar39._0_4_)));
      auVar37 = ZEXT1664(auVar20);
    }
    local_ec = local_ec + 5;
  }
  if (auVar37._0_4_ < 0.0) {
    fVar26 = sqrtf(auVar37._0_4_);
  }
  else {
    auVar17 = vsqrtss_avx(auVar37._0_16_,auVar37._0_16_);
    fVar26 = auVar17._0_4_;
  }
  for (lVar14 = 0; lVar14 != 0x40; lVar14 = lVar14 + 1) {
    ipoint->descriptor[lVar14] = (1.0 / fVar26) * ipoint->descriptor[lVar14];
  }
  return;
}

Assistant:

void get_msurf_descriptor(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int ipoint_x = (int) round(ipoint->x);
    int ipoint_y = (int) round(ipoint->y);

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;
    
    // subregion centers for the 4x4 gaussian weighting
    float cx = -0.5f;
    float cy = 0.0f;

    //float co = 1;
    //float si = 0;

    int i = -8;

    // calculate descriptor for this interest point
    while(i < 12) {

        int j = -8;
        i = i - 4;

        cx += 1.0f; // 4 x Add
        cy = -0.5f;

        while(j < 12) {
            
            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            cy += 1.0f; // 16 x Add

            j = j - 4;

            //int xs = (int) round(ipoint_x + ( -jx*scale*si + ix*scale*co));
            //int ys = (int) round(ipoint_y + ( jx*scale*co + ix*scale*si));
            // TODO: (Sebastian) I think this should be i + 4 and j + 4 (OpenSURF also wrong)
            //int xs = (int) round(ipoint_x + (i + 5) * scale);
            //int ys = (int) round(ipoint_y + (j + 5) * scale);
            int xs = (int) round(ipoint_x + (i + 4.5) * scale); // 16 x Add + 16 x Mul + 16 x round + 16 x float->int
            int ys = (int) round(ipoint_y + (j + 4.5) * scale); // 16 x Add + 16 x Mul + 16 x round + 16 x float->int

            for (int k = i; k < i + 9; ++k) {
                for (int l = j; l < j + 9; ++l) {

                    //Get coords of sample point on the rotated axis
                    //int sample_x = (int) round(ipoint_x + (-l*scale*si + k*scale*co));
                    //int sample_y = (int) round(ipoint_y + ( l*scale*co + k*scale*si));
                    int sample_x = (int) round(ipoint_x + (k+0.5) * scale); // 81*32 x Add + 81*16 x Mul + 81*16 x round + 81*16 x float->int
                    int sample_y = (int) round(ipoint_y + (l+0.5) * scale); // 81*32 x Add + 81*16 x Mul + 81*16 x round + 81*16 x float->int

                    float gauss_s1 = gaussian((float) xs-sample_x, (float) ys-sample_y, 2.5f * scale); // 81*32 x int->float + 81*16 x Mul + 81*16 x gaussian(2 div + 8 x mul + 1 x add + 1 x exp) => Total: 81*32 x int->float + 81*16*9 Mul + 81*16*2 Div + 81*16 Add + 81*16 Exp
                                        
                    float rx = haarX(iimage, sample_y, sample_x, (int) 2.0 * round(scale)); // 81*16 mul + 81*16 round + 81*16 x float->int + 81*16 x haarX(7 x add + 2 x fmax) => Total: 81*16 mul + 81*16 round + 81*16 x float->int + 81*16*7 x add + 81*16*2 x fmax
                    float ry = haarY(iimage, sample_y, sample_x, (int) 2.0 * round(scale)); // 81*16 mul + 81*16 round + 81*16 x float->int + 81*16 x haarY(7 x add + 2 x fmax) => Total: 81*16 mul + 81*16 round + 81*16 x float->int + 81*16*7 x add + 81*16*2 x fmax
                    // printf("sample_x,y:%i %i int_scale:%i rx:%f ry:%f\n",sample_x,sample_y,(int)round(scale),rx,ry);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    //float rrx = gauss_s1*(-rx*si + ry*co);
                    //float rry = gauss_s1*(rx*co + ry*si);
                    // TODO: (Sebastian) This seems weird...
                    float rrx = gauss_s1 * (ry); // 81*16 x Mul
                    float rry = gauss_s1 * (rx); // 81*16 x Mul

                    dx += rrx; // 81*16 x add
                    dy += rry; // 81*16 x add
                    mdx += (float) fabs(rrx); // 81*16 x add + 81*16 x fabs
                    mdy += (float) fabs(rry); // 81*16 x add + 81*16 x fabs

                }      
            }

            // TODO: (Sebastian) Precompute this...
            float gauss_s2 = gaussian(cx-2.0f, cy-2.0f, 1.5f); // 32 x add + 16 x gaussian(2 div + 8 x mul + 1 x add + 1 x exp) => Total: 48 add + 16*8 mul + 32 div + 16 exp

            // add the values to the descriptor vector
            descriptor[desc_idx] = dx * gauss_s2; // 16 x mul
            descriptor[desc_idx+1] = dy * gauss_s2; // 16 x mul
            descriptor[desc_idx+2] = mdx * gauss_s2; // 16 x mul
            descriptor[desc_idx+3] = mdy * gauss_s2; // 16 x mul

            // precompute for normaliztion
            sum_of_squares += (dx*dx + dy*dy + mdx*mdx + mdy*mdy) * gauss_s2*gauss_s2; // 6*16 x mul + 3*16 x add

            desc_idx += 4;

            j += 9;

        }

        i += 9;

    }

    // rescale to unit vector
    float norm_factor = 1.0f / sqrt(sum_of_squares); // 1 x div + 1 x sqrt

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor; // 64 x mul
    }

}